

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_validate.cpp
# Opt level: O0

int __thiscall ktx::CommandValidate::OptionsValidate::init(OptionsValidate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  shared_ptr<cxxopts::Value> *in_stack_fffffffffffffe18;
  shared_ptr<const_cxxopts::Value> *in_stack_fffffffffffffe20;
  shared_ptr<const_cxxopts::Value> *this_00;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  string local_198 [8];
  string *in_stack_fffffffffffffe70;
  Options *in_stack_fffffffffffffe78;
  undefined1 local_151 [40];
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [64];
  string *in_stack_ffffffffffffff40;
  shared_ptr<const_cxxopts::Value> *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  OptionAdder *in_stack_ffffffffffffff60;
  allocator<char> local_91;
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [72];
  EVP_PKEY_CTX *local_10;
  OptionsValidate *local_8;
  
  __s = &local_59;
  local_10 = ctx;
  local_8 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,(char *)__s,(allocator<char> *)ctx);
  cxxopts::Options::add_options(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,(char *)__s,(allocator<char> *)ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,(char *)__s,(allocator<char> *)ctx);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,(char *)__s,(allocator<char> *)ctx);
  cxxopts::OptionAdder::operator()
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,(char *)__s,(allocator<char> *)ctx);
  this_00 = (shared_ptr<const_cxxopts::Value> *)local_151;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,(char *)__s,(allocator<char> *)ctx);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (this_00,in_stack_fffffffffffffe18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,(char *)__s,(allocator<char> *)ctx);
  cxxopts::OptionAdder::operator()
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe67);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x2a9873);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x2a987d);
  std::__cxx11::string::~string((string *)(local_151 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x2a98d8);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x2a98e5);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  cxxopts::OptionAdder::~OptionAdder((OptionAdder *)0x2a9926);
  std::__cxx11::string::~string(local_58);
  iVar1 = std::allocator<char>::~allocator(&local_59);
  return iVar1;
}

Assistant:

void init(cxxopts::Options& opts) {
            opts.add_options()
                ("e,warnings-as-errors", "Treat warnings as errors.")
                ("g,gltf-basisu", "Check compatibility with KHR_texture_basisu glTF extension.");
        }